

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

bool __thiscall QDir::cdUp(QDir *this)

{
  bool bVar1;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"..";
  QString::fromLatin1(&local_30,(QString *)0x2,ba);
  bVar1 = cd(this,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::cdUp()
{
    return cd(QString::fromLatin1(".."));
}